

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

iterator * __thiscall
NNTreeImpl::findInternal
          (iterator *__return_storage_ptr__,NNTreeImpl *this,QPDFObjectHandle *key,
          bool return_prev_if_not_found)

{
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *__x;
  NNTreeDetails *pNVar1;
  QPDF *pQVar2;
  iterator *this_00;
  size_type this_01;
  char cVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  QPDFObjGen og;
  _Node *p_Var7;
  undefined8 extraout_RAX;
  offset_in_NNTreeImpl_to_subr in_R9;
  QPDFObjectHandle items;
  QPDFObjectHandle kids;
  iterator last_item;
  iterator first_item;
  set seen;
  string local_278;
  iterator *local_250;
  string local_248;
  QPDFObjectHandle local_228;
  element_type *local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  element_type *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  QPDFObjectHandle local_1f8;
  QPDFObjectHandle local_1e8;
  QPDFObjectHandle local_1d8;
  QPDFObjectHandle local_1c8;
  QPDFObjectHandle local_1b8;
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  undefined8 local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  element_type *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  undefined8 local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_168;
  size_t *local_160;
  list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>> *local_158;
  NNTreeIterator local_150;
  iterator local_f0;
  undefined1 local_90 [16];
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  element_type *peStack_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  int local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  local_248.field_2._8_8_ = key;
  begin(&local_f0,this);
  iVar5 = local_f0.item_number;
  __x = &local_150.path;
  local_150._vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002eb138;
  local_150.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node._M_size = 0;
  local_150.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_150.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_150.item_number = -1;
  local_150.ivalue.first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_150.ivalue.first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_150.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_150.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_80 = (_Base_ptr)&local_80;
  local_90._0_8_ = &PTR__NNTreeIterator_002eb138;
  local_70 = (_Base_ptr)0x0;
  peStack_68 = (element_type *)0x0;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = -1;
  local_50 = (element_type *)0x0;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40 = (element_type *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_150.impl = this;
  local_150.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__x;
  local_150.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__x;
  local_90._8_8_ = this;
  local_78 = local_80;
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_90);
  if (iVar5 == -1) {
    __return_storage_ptr__->_vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002eb138;
    __return_storage_ptr__->impl = this;
  }
  else {
    if (local_f0.item_number < 0) {
LAB_0012fd6f:
      if (-1 < local_150.item_number) {
        pNVar1 = this->details;
        NNTreeIterator::updateIValue(&local_150,false);
        local_218 = local_150.ivalue.first.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_210 = local_150.ivalue.first.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_150.ivalue.first.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_150.ivalue.first.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_150.ivalue.first.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_150.ivalue.first.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_150.ivalue.first.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        cVar3 = (**(code **)(*(long *)pNVar1 + 8))(pNVar1);
        if (cVar3 == '\0') {
          if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
          }
        }
        else {
          pNVar1 = this->details;
          local_198 = *(undefined8 *)local_248.field_2._8_8_;
          local_190 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_248.field_2._8_8_ + 8))
                      ->_M_pi;
          if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_190->_M_use_count = local_190->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_190->_M_use_count = local_190->_M_use_count + 1;
            }
          }
          NNTreeIterator::updateIValue(&local_150,false);
          local_1a8 = local_150.ivalue.first.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1a0 = local_150.ivalue.first.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_150.ivalue.first.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_150.ivalue.first.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_150.ivalue.first.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_150.ivalue.first.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_150.ivalue.first.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          iVar5 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_198,&local_1a8);
          if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
          }
          if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190);
          }
          if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
          }
          if (0 < iVar5) {
            __return_storage_ptr__->_vptr_NNTreeIterator =
                 (_func_int **)&PTR__NNTreeIterator_002eb138;
            if (return_prev_if_not_found) {
              __return_storage_ptr__->impl = local_150.impl;
              std::__cxx11::
              list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::list
                        (&__return_storage_ptr__->path,__x);
              (__return_storage_ptr__->node).super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   local_150.node.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              (__return_storage_ptr__->node).super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   local_150.node.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              if (local_150.node.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_150.node.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_150.node.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_150.node.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_150.node.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              __return_storage_ptr__->item_number = local_150.item_number;
              std::pair<QPDFObjectHandle,_QPDFObjectHandle>::pair
                        (&__return_storage_ptr__->ivalue,&local_150.ivalue);
              goto LAB_001303e8;
            }
            goto LAB_0012ff94;
          }
        }
      }
      local_78 = (_Base_ptr)(local_90 + 8);
      local_90._8_8_ = local_90._8_8_ & 0xffffffff00000000;
      local_80 = (_Base_ptr)0x0;
      peStack_68 = (element_type *)0x0;
      local_248._M_dataplus._M_p =
           (pointer)(this->oh).super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_248._M_string_length =
           (size_type)
           (this->oh).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length)->
                 _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length)->
                 _M_use_count + 1;
        }
      }
      __return_storage_ptr__->_vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002eb138;
      __return_storage_ptr__->impl = this;
      local_158 = (list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>> *)
                  &__return_storage_ptr__->path;
      (__return_storage_ptr__->path).
      super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_158;
      (__return_storage_ptr__->path).
      super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_158;
      local_160 = &(__return_storage_ptr__->path).
                   super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                   ._M_impl._M_node._M_size;
      (__return_storage_ptr__->path).
      super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
      _M_impl._M_node._M_size = 0;
      (__return_storage_ptr__->node).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->node).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __return_storage_ptr__->item_number = -1;
      (__return_storage_ptr__->ivalue).first.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->ivalue).first.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_168 = &(__return_storage_ptr__->node).super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_250 = __return_storage_ptr__;
      local_70 = local_78;
      do {
        og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)&local_248);
        bVar4 = QPDFObjGen::set::add((set *)local_90,og);
        if (!bVar4) {
          pQVar2 = this->qpdf;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"loop detected in find","");
          ::error(pQVar2,(QPDFObjectHandle *)&local_248,&local_278);
LAB_00130469:
          pQVar2 = this->qpdf;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,
                     "unexpected -1 from binary search of kids; limits may by wrong","");
          ::error(pQVar2,(QPDFObjectHandle *)&local_248,&local_278);
LAB_0013049f:
          pQVar2 = this->qpdf;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"bad node during find","");
          ::error(pQVar2,(QPDFObjectHandle *)&local_248,&local_278);
          if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
          }
          if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190);
          }
          if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
          }
          NNTreeIterator::~NNTreeIterator(&local_150);
          NNTreeIterator::~NNTreeIterator(&local_f0);
          _Unwind_Resume(extraout_RAX);
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"/Kids","");
        QPDFObjectHandle::getKey(&local_1b8,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        bVar4 = QPDFObjectHandle::isArray(&local_1b8);
        iVar5 = 0;
        if (bVar4) {
          iVar5 = QPDFObjectHandle::getArrayNItems(&local_1b8);
        }
        (*(code *)**(undefined8 **)this->details)();
        QPDFObjectHandle::getKey(&local_228,&local_248);
        bVar4 = QPDFObjectHandle::isArray(&local_228);
        if (bVar4) {
          uVar6 = QPDFObjectHandle::getArrayNItems(&local_228);
          if ((int)uVar6 < 1) goto LAB_00130159;
          local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)local_248.field_2._8_8_;
          local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_248.field_2._8_8_ + 8))->_M_pi;
          if (local_1c8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1c8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1c8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1c8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1c8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_228.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               local_228.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_228.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_228.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_228.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_228.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_228.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_278._M_dataplus._M_p = (pointer)compareKeyItem;
          local_278._M_string_length = 0;
          iVar5 = binarySearch(this,&local_1c8,&local_1d8,uVar6 >> 1,return_prev_if_not_found,in_R9)
          ;
          if (local_1d8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1d8.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (local_1c8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1c8.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          this_00 = local_250;
          if (iVar5 < 0) {
            bVar4 = false;
          }
          else {
            (local_250->node).super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_248._M_dataplus._M_p;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (local_168,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_248._M_string_length);
            this_00->item_number = iVar5 * 2;
            NNTreeIterator::updateIValue(this_00,true);
            bVar4 = false;
          }
        }
        else {
LAB_00130159:
          if (iVar5 < 1) goto LAB_0013049f;
          local_1e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)local_248.field_2._8_8_;
          local_1e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_248.field_2._8_8_ + 8))->_M_pi;
          if (local_1e8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1e8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1e8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1e8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1e8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_1f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_1b8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               local_1b8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_1b8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1b8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1b8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1b8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1b8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_278._M_dataplus._M_p = (pointer)compareKeyKid;
          local_278._M_string_length = 0;
          iVar5 = binarySearch(this,&local_1e8,&local_1f8,iVar5,true,in_R9);
          if (local_1f8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1f8.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (local_1e8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1e8.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (iVar5 == -1) goto LAB_00130469;
          local_278._M_dataplus._M_p._0_4_ = iVar5;
          p_Var7 = std::__cxx11::
                   list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>>::
                   _M_create_node<QPDFObjectHandle_const&,int&>
                             (local_158,(QPDFObjectHandle *)&local_248,(int *)&local_278);
          std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
          *local_160 = *local_160 + 1;
          QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_278,(int)&local_1b8);
          this_01 = local_248._M_string_length;
          local_248._M_string_length = local_278._M_string_length;
          local_248._M_dataplus._M_p = local_278._M_dataplus._M_p;
          local_278._M_dataplus._M_p = (pointer)0x0;
          local_278._M_string_length = 0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length)
              ;
            }
          }
          bVar4 = true;
        }
        if (local_228.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_228.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_1b8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1b8.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      } while (bVar4);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length);
      }
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                   *)local_90);
      __return_storage_ptr__ = local_250;
      goto LAB_001303e8;
    }
    pNVar1 = this->details;
    NNTreeIterator::updateIValue(&local_f0,false);
    local_208 = local_f0.ivalue.first.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_200 = local_f0.ivalue.first.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_f0.ivalue.first.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f0.ivalue.first.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             = (local_f0.ivalue.first.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f0.ivalue.first.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             = (local_f0.ivalue.first.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
      }
    }
    cVar3 = (**(code **)(*(long *)pNVar1 + 8))(pNVar1);
    if (cVar3 == '\0') {
      if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
      }
      goto LAB_0012fd6f;
    }
    pNVar1 = this->details;
    local_178 = *(undefined8 *)local_248.field_2._8_8_;
    local_170 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_248.field_2._8_8_ + 8))->_M_pi
    ;
    if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_170->_M_use_count = local_170->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_170->_M_use_count = local_170->_M_use_count + 1;
      }
    }
    NNTreeIterator::updateIValue(&local_f0,false);
    local_188 = local_f0.ivalue.first.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_180 = local_f0.ivalue.first.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_f0.ivalue.first.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f0.ivalue.first.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             = (local_f0.ivalue.first.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f0.ivalue.first.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             = (local_f0.ivalue.first.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
      }
    }
    iVar5 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_178,&local_188);
    if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
    }
    if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
    }
    if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
    }
    if (-1 < iVar5) goto LAB_0012fd6f;
    __return_storage_ptr__->_vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002eb138;
LAB_0012ff94:
    __return_storage_ptr__->impl = this;
  }
  (__return_storage_ptr__->path).
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&__return_storage_ptr__->path;
  (__return_storage_ptr__->path).
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&__return_storage_ptr__->path;
  (__return_storage_ptr__->path).
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node._M_size = 0;
  (__return_storage_ptr__->node).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->node).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->item_number = -1;
  (__return_storage_ptr__->ivalue).first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->ivalue).first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001303e8:
  NNTreeIterator::~NNTreeIterator(&local_150);
  NNTreeIterator::~NNTreeIterator(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::findInternal(QPDFObjectHandle key, bool return_prev_if_not_found)
{
    auto first_item = begin();
    auto last_item = end();
    if (first_item == end()) {
        // Empty
        return end();
    } else if (
        first_item.valid() && details.keyValid(first_item->first) &&
        details.compareKeys(key, first_item->first) < 0) {
        // Before the first key
        return end();
    } else if (
        last_item.valid() && details.keyValid(last_item->first) &&
        details.compareKeys(key, last_item->first) > 0) {
        // After the last key
        if (return_prev_if_not_found) {
            return last_item;
        } else {
            return end();
        }
    }

    QPDFObjGen::set seen;
    auto node = this->oh;
    iterator result(*this);

    while (true) {
        if (!seen.add(node)) {
            QTC::TC("qpdf", "NNTree loop in find");
            error(qpdf, node, "loop detected in find");
        }

        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;
        if (nitems > 0) {
            int idx = binarySearch(
                key, items, nitems / 2, return_prev_if_not_found, &NNTreeImpl::compareKeyItem);
            if (idx >= 0) {
                result.setItemNumber(node, 2 * idx);
            }
            break;
        } else if (nkids > 0) {
            int idx = binarySearch(key, kids, nkids, true, &NNTreeImpl::compareKeyKid);
            if (idx == -1) {
                QTC::TC("qpdf", "NNTree -1 in binary search");
                error(
                    qpdf,
                    node,
                    "unexpected -1 from binary search of kids;"
                    " limits may by wrong");
            }
            result.addPathElement(node, idx);
            node = kids.getArrayItem(idx);
        } else {
            QTC::TC("qpdf", "NNTree bad node during find");
            error(qpdf, node, "bad node during find");
        }
    }

    return result;
}